

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

void __thiscall cmCTestTestHandler::Initialize(cmCTestTestHandler *this)

{
  cmDuration local_18;
  cmCTestTestHandler *local_10;
  cmCTestTestHandler *this_local;
  
  local_10 = this;
  cmCTestGenericHandler::Initialize(&this->super_cmCTestGenericHandler);
  memset(&local_18,0,8);
  (this->ElapsedTestingTime).__r = local_18.__r;
  std::
  vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
  ::clear(&this->TestResults);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->CustomTestsIgnore);
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->CustomPreTest);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->CustomPostTest);
  this->CustomMaximumPassedTestOutputSize = 0x400;
  this->CustomMaximumFailedTestOutputSize = 0x4b000;
  this->TestOutputTruncation = Tail;
  std::vector<int,_std::allocator<int>_>::clear(&this->TestsToRun);
  this->UseIncludeRegExpFlag = false;
  this->UseExcludeRegExpFlag = false;
  this->UseExcludeRegExpFirst = false;
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
            (&this->IncludeLabelRegularExpressions);
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
            (&this->ExcludeLabelRegularExpressions);
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  this->UseUnion = false;
  std::
  vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
  ::clear(&this->TestList);
  return;
}

Assistant:

void cmCTestTestHandler::Initialize()
{
  this->Superclass::Initialize();

  this->ElapsedTestingTime = cmDuration();

  this->TestResults.clear();

  this->CustomTestsIgnore.clear();
  this->StartTest.clear();
  this->EndTest.clear();

  this->CustomPreTest.clear();
  this->CustomPostTest.clear();
  this->CustomMaximumPassedTestOutputSize = 1 * 1024;
  this->CustomMaximumFailedTestOutputSize = 300 * 1024;
  this->TestOutputTruncation = cmCTestTypes::TruncationMode::Tail;

  this->TestsToRun.clear();

  this->UseIncludeRegExpFlag = false;
  this->UseExcludeRegExpFlag = false;
  this->UseExcludeRegExpFirst = false;
  this->IncludeLabelRegularExpressions.clear();
  this->ExcludeLabelRegularExpressions.clear();
  this->IncludeRegExp.clear();
  this->ExcludeRegExp.clear();
  this->ExcludeFixtureRegExp.clear();
  this->ExcludeFixtureSetupRegExp.clear();
  this->ExcludeFixtureCleanupRegExp.clear();

  this->TestsToRunString.clear();
  this->UseUnion = false;
  this->TestList.clear();
}